

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_option.hpp
# Opt level: O2

string * __thiscall
duckdb::CSVOption<duckdb::StrpTimeFormat>::FormatSet_abi_cxx11_
          (string *__return_storage_ptr__,CSVOption<duckdb::StrpTimeFormat> *this)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_a;
  allocator local_9;
  
  if (this->set_by_user == true) {
    pcVar2 = "(Set By User)";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "(Auto-Detected)";
    paVar1 = &local_a;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

string FormatSet() const {
		if (set_by_user) {
			return "(Set By User)";
		}
		return "(Auto-Detected)";
	}